

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

int ON_DimStyle::V5ArrowType(arrow_type v6type)

{
  int local_10;
  int v5type;
  arrow_type v6type_local;
  
  switch(v6type) {
  default:
    local_10 = 0;
    break;
  case Dot:
    local_10 = 1;
    break;
  case Tick:
    local_10 = 2;
    break;
  case ShortTriangle:
    local_10 = 3;
    break;
  case OpenArrow:
    local_10 = 4;
    break;
  case Rectangle:
    local_10 = 5;
    break;
  case LongTriangle:
    local_10 = 6;
    break;
  case LongerTriangle:
    local_10 = 7;
  }
  return local_10;
}

Assistant:

int ON_DimStyle::V5ArrowType(ON_Arrowhead::arrow_type v6type)
{
  int v5type;
  switch (v6type)
  {
  default:
  case ON_Arrowhead::arrow_type::SolidTriangle:
  case ON_Arrowhead::arrow_type::UserBlock:
    v5type = ON_V5x_DimStyle::eArrowType::solidtriangle;
    break;
  case ON_Arrowhead::arrow_type::Dot:
    v5type = ON_V5x_DimStyle::eArrowType::dot;
    break;
  case ON_Arrowhead::arrow_type::Tick:
    v5type = ON_V5x_DimStyle::eArrowType::tick;
    break;
  case ON_Arrowhead::arrow_type::ShortTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::shorttriangle;
    break;
  case ON_Arrowhead::arrow_type::OpenArrow:
    v5type = ON_V5x_DimStyle::eArrowType::arrow;
    break;
  case ON_Arrowhead::arrow_type::Rectangle:
    v5type = ON_V5x_DimStyle::eArrowType::rectangle;
    break;
  case ON_Arrowhead::arrow_type::LongTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::longtriangle;
    break;
  case ON_Arrowhead::arrow_type::LongerTriangle:
    v5type = ON_V5x_DimStyle::eArrowType::longertriangle;
    break;
  }

  return v5type;
}